

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling.c
# Opt level: O2

void WebPInitUpsamplers(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&WebPInitUpsamplers::WebPInitUpsamplers_body_lock);
  if (iVar1 != 0) {
    return;
  }
  if (WebPInitUpsamplers::WebPInitUpsamplers_body_last_cpuinfo_used != VP8GetCPUInfo) {
    WebPUpsamplers[1] = UpsampleRgbaLinePair_C;
    WebPUpsamplers[3] = UpsampleBgraLinePair_C;
    WebPUpsamplers[7] = UpsampleRgbaLinePair_C;
    WebPUpsamplers[8] = UpsampleBgraLinePair_C;
    WebPUpsamplers[0] = UpsampleRgbLinePair_C;
    WebPUpsamplers[2] = UpsampleBgrLinePair_C;
    WebPUpsamplers[4] = UpsampleArgbLinePair_C;
    WebPUpsamplers[5] = UpsampleRgba4444LinePair_C;
    WebPUpsamplers[6] = UpsampleRgb565LinePair_C;
    WebPUpsamplers[9] = UpsampleArgbLinePair_C;
    WebPUpsamplers[10] = UpsampleRgba4444LinePair_C;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar1 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar1 != 0) {
        WebPInitUpsamplersSSE2();
      }
      iVar1 = (*VP8GetCPUInfo)(kSSE4_1);
      if (iVar1 != 0) {
        WebPInitUpsamplersSSE41();
      }
    }
  }
  WebPInitUpsamplers::WebPInitUpsamplers_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock((pthread_mutex_t *)&WebPInitUpsamplers::WebPInitUpsamplers_body_lock);
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(WebPInitUpsamplers) {
#ifdef FANCY_UPSAMPLING
#if !WEBP_NEON_OMIT_C_CODE
  WebPUpsamplers[MODE_RGBA]      = UpsampleRgbaLinePair_C;
  WebPUpsamplers[MODE_BGRA]      = UpsampleBgraLinePair_C;
  WebPUpsamplers[MODE_rgbA]      = UpsampleRgbaLinePair_C;
  WebPUpsamplers[MODE_bgrA]      = UpsampleBgraLinePair_C;
  WebPUpsamplers[MODE_RGB]       = UpsampleRgbLinePair_C;
  WebPUpsamplers[MODE_BGR]       = UpsampleBgrLinePair_C;
  WebPUpsamplers[MODE_ARGB]      = UpsampleArgbLinePair_C;
  WebPUpsamplers[MODE_RGBA_4444] = UpsampleRgba4444LinePair_C;
  WebPUpsamplers[MODE_RGB_565]   = UpsampleRgb565LinePair_C;
  WebPUpsamplers[MODE_Argb]      = UpsampleArgbLinePair_C;
  WebPUpsamplers[MODE_rgbA_4444] = UpsampleRgba4444LinePair_C;
#endif

  // If defined, use CPUInfo() to overwrite some pointers with faster versions.
  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      WebPInitUpsamplersSSE2();
    }
#endif
#if defined(WEBP_HAVE_SSE41)
    if (VP8GetCPUInfo(kSSE4_1)) {
      WebPInitUpsamplersSSE41();
    }
#endif
#if defined(WEBP_USE_MIPS_DSP_R2)
    if (VP8GetCPUInfo(kMIPSdspR2)) {
      WebPInitUpsamplersMIPSdspR2();
    }
#endif
#if defined(WEBP_USE_MSA)
    if (VP8GetCPUInfo(kMSA)) {
      WebPInitUpsamplersMSA();
    }
#endif
  }

#if defined(WEBP_HAVE_NEON)
  if (WEBP_NEON_OMIT_C_CODE ||
      (VP8GetCPUInfo != NULL && VP8GetCPUInfo(kNEON))) {
    WebPInitUpsamplersNEON();
  }
#endif

  assert(WebPUpsamplers[MODE_RGBA] != NULL);
  assert(WebPUpsamplers[MODE_BGRA] != NULL);
  assert(WebPUpsamplers[MODE_rgbA] != NULL);
  assert(WebPUpsamplers[MODE_bgrA] != NULL);
#if !defined(WEBP_REDUCE_CSP) || !WEBP_NEON_OMIT_C_CODE
  assert(WebPUpsamplers[MODE_RGB] != NULL);
  assert(WebPUpsamplers[MODE_BGR] != NULL);
  assert(WebPUpsamplers[MODE_ARGB] != NULL);
  assert(WebPUpsamplers[MODE_RGBA_4444] != NULL);
  assert(WebPUpsamplers[MODE_RGB_565] != NULL);
  assert(WebPUpsamplers[MODE_Argb] != NULL);
  assert(WebPUpsamplers[MODE_rgbA_4444] != NULL);
#endif

#endif  // FANCY_UPSAMPLING
}